

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineeFrameInfo.cpp
# Opt level: O0

void __thiscall
InlineeFrameInfo::AllocateRecord(InlineeFrameInfo *this,Func *inlinee,intptr_t functionBodyAddr)

{
  code *pcVar1;
  anon_class_40_5_d71758f0 map;
  bool bVar2;
  uint argCount;
  Allocator *alloc;
  InlineeFrameRecord *pIVar3;
  undefined4 *puVar4;
  Var pvVar5;
  int offset;
  uint local_38 [2];
  uint constantIndex;
  uint i;
  uint local_24;
  intptr_t iStack_20;
  uint constantCount;
  intptr_t functionBodyAddr_local;
  Func *inlinee_local;
  InlineeFrameInfo *this_local;
  
  local_24 = 0;
  _constantIndex = &local_24;
  iStack_20 = functionBodyAddr;
  functionBodyAddr_local = (intptr_t)inlinee;
  inlinee_local = (Func *)this;
  JsUtil::
  List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
  Map<InlineeFrameInfo::AllocateRecord(Func*,long)::__0>
            ((List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              *)this->arguments,_constantIndex);
  bVar2 = InlineFrameInfoValue::IsConst(&this->function);
  if (bVar2) {
    local_24 = local_24 + 1;
  }
  if (this->record == (InlineeFrameRecord *)0x0) {
    alloc = Func::GetNativeCodeDataAllocator((Func *)functionBodyAddr_local);
    argCount = JsUtil::
               ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>::Count
                         (&this->arguments->
                           super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                         );
    pIVar3 = InlineeFrameRecord::New(alloc,argCount,local_24,iStack_20,this);
    this->record = pIVar3;
  }
  local_38[1] = 0;
  local_38[0] = 0;
  map.i = local_38 + 1;
  map.this = this;
  map.constantIndex = local_38;
  map.constantCount = &local_24;
  map.inlinee = (Func **)&functionBodyAddr_local;
  JsUtil::
  List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
  Map<InlineeFrameInfo::AllocateRecord(Func*,long)::__1>
            ((List<InlineFrameInfoValue,Memory::JitArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
              *)this->arguments,map);
  if ((this->function).type == InlineeFrameInfoValueType_Sym) {
    this->record->functionOffset = ((this->function).field_1.sym)->m_offset + -0x10;
  }
  else if ((*(uint *)(functionBodyAddr_local + 0x240) >> 1 & 1) != 0) {
    if (local_24 <= local_38[0]) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InlineeFrameInfo.cpp"
                         ,0x9a,"(constantIndex < constantCount)","constantIndex < constantCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pvVar5 = BailoutConstantValue::ToVar
                       (&(this->function).field_1.constValue,(Func *)functionBodyAddr_local);
    this->record->constants[local_38[0]] = pvVar5;
    this->record->functionOffset = local_38[0];
  }
  return;
}

Assistant:

void InlineeFrameInfo::AllocateRecord(Func* inlinee, intptr_t functionBodyAddr)
{
    uint constantCount = 0;

    // If there are no helper calls there is a chance that frame record is not required after all;
    arguments->Map([&](uint index, InlineFrameInfoValue& value){
        if (value.IsConst())
        {
            constantCount++;
        }
    });

    if (function.IsConst())
    {
        constantCount++;
    }

    // For InlineeEnd's that have been cloned we can result in multiple calls
    // to allocate the record - do not allocate a new record - instead update the existing one.
    // In particular, if the first InlineeEnd resulted in no calls and spills, subsequent might still spill - so it's a good idea to
    // update the record
    if (!this->record)
    {
        this->record = InlineeFrameRecord::New(inlinee->GetNativeCodeDataAllocator(), (uint)arguments->Count(), constantCount, functionBodyAddr, this);
    }

    uint i = 0;
    uint constantIndex = 0;
    arguments->Map([&](uint index, InlineFrameInfoValue& value){
        Assert(value.type != InlineeFrameInfoValueType_None);
        if (value.type == InlineeFrameInfoValueType_Sym)
        {
            int offset;
#ifdef MD_GROW_LOCALS_AREA_UP
            offset = -((int)value.sym->m_offset + BailOutInfo::StackSymBias);
#else
            // Stack offset are negative, includes the PUSH EBP and return address
            offset = value.sym->m_offset - (2 * MachPtr);
#endif
            Assert(offset < 0);
            this->record->argOffsets[i] = offset;
            if (value.sym->IsFloat64())
            {
                this->record->floatArgs.Set(i);
            }
            else if (value.sym->IsInt32())
            {
                this->record->losslessInt32Args.Set(i);
            }
        }
        else
        {
            // Constants
            Assert(constantIndex < constantCount);
            this->record->constants[constantIndex] = value.constValue.ToVar(inlinee);
            this->record->argOffsets[i] = constantIndex;
            constantIndex++;
        }
        i++;
    });

    if (function.type == InlineeFrameInfoValueType_Sym)
    {
        int offset;

#ifdef MD_GROW_LOCALS_AREA_UP
        offset = -((int)function.sym->m_offset + BailOutInfo::StackSymBias);
#else
        // Stack offset are negative, includes the PUSH EBP and return address
        offset = function.sym->m_offset - (2 * MachPtr);
#endif
        this->record->functionOffset = offset;
    }
    else if (inlinee->m_hasInlineArgsOpt)
    {
        Assert(constantIndex < constantCount);
        this->record->constants[constantIndex] = function.constValue.ToVar(inlinee);
        this->record->functionOffset = constantIndex;
    }
}